

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::ReflectionClassGenerator
          (ReflectionClassGenerator *this,FileDescriptor *file,Options *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FileDescriptor *descriptor;
  FileDescriptor *extraout_RDX;
  FileDescriptor *extraout_RDX_00;
  FileDescriptor *extraout_RDX_01;
  FileDescriptor *extraout_RDX_02;
  FileDescriptor *pFVar2;
  string local_58;
  string *local_38;
  
  SourceGeneratorBase::SourceGeneratorBase(&this->super_SourceGeneratorBase,options);
  (this->super_SourceGeneratorBase)._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__ReflectionClassGenerator_008478a8;
  this->file_ = file;
  (this->namespace_)._M_dataplus._M_p = (pointer)&(this->namespace_).field_2;
  (this->namespace_)._M_string_length = 0;
  (this->namespace_).field_2._M_local_buf[0] = '\0';
  (this->reflectionClassname_)._M_dataplus._M_p = (pointer)&(this->reflectionClassname_).field_2;
  (this->reflectionClassname_)._M_string_length = 0;
  (this->reflectionClassname_).field_2._M_local_buf[0] = '\0';
  (this->extensionClassname_)._M_dataplus._M_p = (pointer)&(this->extensionClassname_).field_2;
  (this->extensionClassname_)._M_string_length = 0;
  (this->extensionClassname_).field_2._M_local_buf[0] = '\0';
  local_38 = &this->namespace_;
  GetFileNamespace_abi_cxx11_(&local_58,(csharp *)file,descriptor);
  std::__cxx11::string::operator=((string *)&this->namespace_,(string *)&local_58);
  paVar1 = &local_58.field_2;
  pFVar2 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    pFVar2 = extraout_RDX_00;
  }
  GetReflectionClassUnqualifiedName_abi_cxx11_(&local_58,(csharp *)file,pFVar2);
  std::__cxx11::string::operator=((string *)&this->reflectionClassname_,(string *)&local_58);
  pFVar2 = extraout_RDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    pFVar2 = extraout_RDX_02;
  }
  GetExtensionClassUnqualifiedName_abi_cxx11_(&local_58,(csharp *)file,pFVar2);
  std::__cxx11::string::operator=((string *)&this->extensionClassname_,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ReflectionClassGenerator::ReflectionClassGenerator(const FileDescriptor* file,
                                                   const Options* options)
    : SourceGeneratorBase(options),
      file_(file) {
  namespace_ = GetFileNamespace(file);
  reflectionClassname_ = GetReflectionClassUnqualifiedName(file);
  extensionClassname_ = GetExtensionClassUnqualifiedName(file);
}